

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapepiram.cpp
# Opt level: O2

void pzshape::TPZShapePiram::ShapeOrder
               (TPZVec<long> *id,TPZVec<int> *order,TPZGenMatrix<int> *shapeorders)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  int64_t Rows;
  ulong uVar5;
  long i;
  ulong i_00;
  int jc;
  ulong j;
  TPZGenMatrix<int> locshapeorders;
  
  i = 0;
  for (uVar5 = 0; uVar5 != 0x13; uVar5 = uVar5 + 1) {
    if (uVar5 < 5) {
      Rows = 1;
      iVar3 = 1;
    }
    else {
      iVar3 = NConnectShapeF((int)uVar5,order->fStore[uVar5 - 5]);
      Rows = (int64_t)iVar3;
      iVar3 = order->fStore[uVar5 - 5];
    }
    TPZGenMatrix<int>::TPZGenMatrix(&locshapeorders,Rows,3);
    SideShapeOrder((int)uVar5,id,iVar3,&locshapeorders);
    uVar1 = (uint)locshapeorders.fCols;
    if ((int)(uint)locshapeorders.fCols < 1) {
      uVar1 = 0;
    }
    i = (long)(int)i;
    uVar2 = (uint)locshapeorders.fRows;
    if ((int)(uint)locshapeorders.fRows < 1) {
      uVar2 = 0;
    }
    for (i_00 = 0; i_00 != uVar2; i_00 = i_00 + 1) {
      for (j = 0; uVar1 != j; j = j + 1) {
        piVar4 = TPZGenMatrix<int>::operator()(&locshapeorders,i_00,j);
        iVar3 = *piVar4;
        piVar4 = TPZGenMatrix<int>::operator()(shapeorders,i,j);
        *piVar4 = iVar3;
      }
      i = i + 1;
    }
    TPZGenMatrix<int>::~TPZGenMatrix(&locshapeorders);
  }
  return;
}

Assistant:

void TPZShapePiram::ShapeOrder(const TPZVec<int64_t> &id, const TPZVec<int> &order, TPZGenMatrix<int> &shapeorders)//, TPZVec<int64_t> &sides
    {
        //DebugStop();
        int64_t nsides = TPZShapePiram::NSides;
        int nshape;
        
        int linha = 0;
        for (int side = 0; side < nsides; side++)
        {
            
            nshape = 1;
            if(side >= NCornerNodes) nshape = NConnectShapeF(side,order[side-NCornerNodes]);
            int sideorder = 1;
            if(side >= NCornerNodes) sideorder = order[side-NCornerNodes];
            
            TPZGenMatrix<int> locshapeorders(nshape,3);
            SideShapeOrder(side, id, sideorder, locshapeorders);
            
            int nlin = locshapeorders.Rows();
            int ncol = locshapeorders.Cols();
            
            for (int il = 0; il<nlin; il++)
            {
                for (int jc = 0; jc<ncol; jc++)
                {
                    shapeorders(linha, jc) = locshapeorders(il, jc);
                }
                linha++;
            }
        }
    }